

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGXMLScanner.cpp
# Opt level: O1

bool __thiscall xercesc_4_0::DGXMLScanner::scanNext(DGXMLScanner *this,XMLPScanToken *token)

{
  ReaderMgr *this_00;
  XMLDocumentHandler *pXVar1;
  bool bVar2;
  XMLCh XVar3;
  XMLTokens XVar4;
  StackElem *pSVar5;
  XMLCh *text1;
  RuntimeException *this_01;
  bool gotData;
  ReaderMgrResetType resetReaderMgr;
  XMLSize_t orgReader;
  bool local_49;
  JanitorMemFunCall<xercesc_4_0::ReaderMgr> local_48;
  XMLSize_t local_30;
  
  bVar2 = XMLScanner::isLegalToken(&this->super_XMLScanner,token);
  if (!bVar2) {
    this_01 = (RuntimeException *)__cxa_allocate_exception(0x30);
    RuntimeException::RuntimeException
              (this_01,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/DGXMLScanner.cpp"
               ,0x10e,Scan_BadPScanToken,(this->super_XMLScanner).fMemoryManager);
    __cxa_throw(this_01,&RuntimeException::typeinfo,XMLException::~XMLException);
  }
  this_00 = &(this->super_XMLScanner).fReaderMgr;
  local_48.fToCall = (MFPT)ReaderMgr::reset;
  local_48._16_8_ = 0;
  local_48.fObject = this_00;
  XVar4 = XMLScanner::senseNextToken(&this->super_XMLScanner,&local_30);
  if (XVar4 == Token_CharData) {
    bVar2 = true;
    (*(this->super_XMLScanner).super_XMLBufferFullHandler._vptr_XMLBufferFullHandler[0xc])
              (this,&(this->super_XMLScanner).fCDataBuf);
  }
  else if (XVar4 == Token_EOF) {
    if ((this->super_XMLScanner).fElemStack.fStackTop == 0) {
      bVar2 = false;
    }
    else {
      pSVar5 = ElemStack::popTop(&(this->super_XMLScanner).fElemStack);
      text1 = QName::getRawName(pSVar5->fThisElement->fElementName);
      bVar2 = false;
      XMLScanner::emitError
                (&this->super_XMLScanner,EndedWithTagsOnStack,text1,(XMLCh *)0x0,(XMLCh *)0x0,
                 (XMLCh *)0x0);
    }
  }
  else {
    local_49 = true;
    switch(XVar4) {
    case Token_CData:
      if ((this->super_XMLScanner).fElemStack.fStackTop == 0) {
        XMLScanner::emitError(&this->super_XMLScanner,CDATAOutsideOfContent);
      }
      (*(this->super_XMLScanner).super_XMLBufferFullHandler._vptr_XMLBufferFullHandler[0xb])(this);
      break;
    default:
      do {
        XVar3 = ReaderMgr::getNextChar(this_00);
        if (XVar3 == L'<') break;
      } while (XVar3 != L'\0');
      break;
    case Token_Comment:
      XMLScanner::scanComment(&this->super_XMLScanner);
      break;
    case Token_EndTag:
      scanEndTag(this,&local_49);
      break;
    case Token_PI:
      XMLScanner::scanPI(&this->super_XMLScanner);
      break;
    case Token_StartTag:
      if ((this->super_XMLScanner).fDoNamespaces == true) {
        scanStartTagNS(this,&local_49);
      }
      else {
        scanStartTag(this,&local_49);
      }
    }
    if (local_30 != ((this->super_XMLScanner).fReaderMgr.fCurReader)->fReaderNum) {
      XMLScanner::emitError(&this->super_XMLScanner,PartialMarkupInEntity);
    }
    if (local_49 == false) {
      if ((this->super_XMLScanner).fValidate == true) {
        XMLScanner::checkIDRefs(&this->super_XMLScanner);
      }
      XMLScanner::scanMiscellaneous(&this->super_XMLScanner);
      pXVar1 = (this->super_XMLScanner).fDocHandler;
      if (pXVar1 != (XMLDocumentHandler *)0x0) {
        (*pXVar1->_vptr_XMLDocumentHandler[5])();
      }
    }
    bVar2 = true;
  }
  if (bVar2 != false) {
    local_48.fObject = (ReaderMgr *)0x0;
  }
  JanitorMemFunCall<xercesc_4_0::ReaderMgr>::~JanitorMemFunCall(&local_48);
  return bVar2;
}

Assistant:

bool DGXMLScanner::scanNext(XMLPScanToken& token)
{
    // Make sure this token is still legal
    if (!isLegalToken(token))
        ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::Scan_BadPScanToken, fMemoryManager);

    // Find the next token and remember the reader id
    XMLSize_t orgReader;
    XMLTokens curToken;

    ReaderMgrResetType  resetReaderMgr(&fReaderMgr, &ReaderMgr::reset);

    bool retVal = true;

    try
    {
        while (true)
        {
            //  We have to handle any end of entity exceptions that happen here.
            //  We could be at the end of X nested entities, each of which will
            //  generate an end of entity exception as we try to move forward.
            try
            {
                curToken = senseNextToken(orgReader);
                break;
            }
            catch(const EndOfEntityException& toCatch)
            {
                // Send an end of entity reference event
                if (fDocHandler)
                    fDocHandler->endEntityReference(toCatch.getEntity());
            }
        }

        if (curToken == Token_CharData)
        {
            scanCharData(fCDataBuf);
        }
        else if (curToken == Token_EOF)
        {
            if (!fElemStack.isEmpty())
            {
                const ElemStack::StackElem* topElem = fElemStack.popTop();
                emitError
                (
                    XMLErrs::EndedWithTagsOnStack
                    , topElem->fThisElement->getFullName()
                );
            }

            retVal = false;
        }
        else
        {
            // Its some sort of markup
            bool gotData = true;
            switch(curToken)
            {
                case Token_CData :
                    // Make sure we are within content
                    if (fElemStack.isEmpty())
                        emitError(XMLErrs::CDATAOutsideOfContent);
                    scanCDSection();
                    break;

                case Token_Comment :
                    scanComment();
                    break;

                case Token_EndTag :
                    scanEndTag(gotData);
                    break;

                case Token_PI :
                    scanPI();
                    break;

                case Token_StartTag :
                    if (fDoNamespaces)
                        scanStartTagNS(gotData);
                    else
                        scanStartTag(gotData);
                    break;

                default :
                    fReaderMgr.skipToChar(chOpenAngle);
                    break;
            }

            if (orgReader != fReaderMgr.getCurrentReaderNum())
                emitError(XMLErrs::PartialMarkupInEntity);

            // If we hit the end, then do the miscellaneous part
            if (!gotData)
            {
                // Do post-parse validation if required
                if (fValidate)
                {
                    //  We handle ID reference semantics at this level since
                    //  its required by XML 1.0.
                    checkIDRefs();

                    // Then allow the validator to do any extra stuff it wants
//                    fValidator->postParseValidation();
                }

                // That went ok, so scan for any miscellaneous stuff
                scanMiscellaneous();

                if (fDocHandler)
                    fDocHandler->endDocument();
            }
        }
    }
    //  NOTE:
    //
    //  In all of the error processing below, the emitError() call MUST come
    //  before the flush of the reader mgr, or it will fail because it tries
    //  to find out the position in the XML source of the error.
    catch(const XMLErrs::Codes)
    {
        // This is a 'first failure' exception, so return failure
        retVal = false;
    }
    catch(const XMLValid::Codes)
    {
        // This is a 'first fatal error' type exit, so return failure
        retVal = false;
    }
    catch(const XMLException& excToCatch)
    {
        //  Emit the error and catch any user exception thrown from here. Make
        //  sure in all cases we flush the reader manager.
        fInException = true;
        try
        {
            if (excToCatch.getErrorType() == XMLErrorReporter::ErrType_Warning)
                emitError
                (
                    XMLErrs::XMLException_Warning
                    , excToCatch.getCode()
                    , excToCatch.getMessage()
                );
            else if (excToCatch.getErrorType() >= XMLErrorReporter::ErrType_Fatal)
                emitError
                (
                    XMLErrs::XMLException_Fatal
                    , excToCatch.getCode()
                    , excToCatch.getMessage()
                );
            else
                emitError
                (
                    XMLErrs::XMLException_Error
                    , excToCatch.getCode()
                    , excToCatch.getMessage()
                );
        }
        catch(const OutOfMemoryException&)
        {
            // This is a special case for out-of-memory
            // conditions, because resetting the ReaderMgr
            // can be problematic.
            resetReaderMgr.release();

            throw;
        }

        retVal = false;
    }
    catch(const OutOfMemoryException&)
    {
        // This is a special case for out-of-memory
        // conditions, because resetting the ReaderMgr
        // can be problematic.
        resetReaderMgr.release();

        throw;
    }

    // If we are not at the end, release the object that will
    // reset the ReaderMgr.
    if (retVal)
        resetReaderMgr.release();

    return retVal;
}